

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<capnp::RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>_>::
~ExceptionOr(ExceptionOr<capnp::RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>_>
             *this)

{
  PipelineOp *pPVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  PipelineHook *pPVar4;
  Disposer *pDVar5;
  PromiseArenaMember *node;
  
  if ((this->value).ptr.isSet == true) {
    pPVar1 = (this->value).ptr.field_1.value.super_Pipeline._typeless.ops.ptr;
    if (pPVar1 != (PipelineOp *)0x0) {
      sVar2 = (this->value).ptr.field_1.value.super_Pipeline._typeless.ops.size_;
      (this->value).ptr.field_1.value.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
      (this->value).ptr.field_1.value.super_Pipeline._typeless.ops.size_ = 0;
      pAVar3 = (this->value).ptr.field_1.value.super_Pipeline._typeless.ops.disposer;
      (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pPVar1,8,sVar2,sVar2,0);
    }
    pPVar4 = (this->value).ptr.field_1.value.super_Pipeline._typeless.hook.ptr;
    if (pPVar4 != (PipelineHook *)0x0) {
      (this->value).ptr.field_1.value.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
      pDVar5 = (this->value).ptr.field_1.value.super_Pipeline._typeless.hook.disposer;
      (**pDVar5->_vptr_Disposer)
                (pDVar5,(_func_int *)
                        ((long)&pPVar4->_vptr_PipelineHook + (long)pPVar4->_vptr_PipelineHook[-2]));
    }
    node = &((this->value).ptr.field_1.value.
             super_Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>
             .super_PromiseBase.node.ptr)->super_PromiseArenaMember;
    if (node != (PromiseArenaMember *)0x0) {
      (this->value).ptr.field_1.value.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>.
      super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      PromiseDisposer::dispose(node);
    }
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}